

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

bool __thiscall
MT32Emu::Synth::getSoundName(Synth *this,char *soundName,Bit8u timbreGroup,Bit8u timbreNumber)

{
  MemParams *pMVar1;
  byte bVar2;
  ulong uVar3;
  
  if ((timbreGroup < 4) && (this->opened != false)) {
    if (timbreGroup == '\x03') {
      bVar2 = (byte)this->controlROMMap->timbreRCount;
    }
    else {
      bVar2 = 0x40;
    }
    if (timbreNumber < bVar2) {
      pMVar1 = this->mt32ram;
      uVar3 = (ulong)(((uint)(byte)(timbreGroup << 6) + (uint)timbreNumber) * 0x100);
      if (pMVar1->timbres[0].timbre.common.name[uVar3 + 0xc] != '\0') {
        *(undefined2 *)(soundName + 8) =
             *(undefined2 *)(pMVar1->timbres[0].timbre.common.name + uVar3 + 8);
        *(undefined8 *)soundName = *(undefined8 *)(pMVar1->timbres[0].timbre.common.name + uVar3);
        soundName[10] = '\0';
        return true;
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool Synth::getSoundName(char *soundName, Bit8u timbreGroup, Bit8u timbreNumber) const {
	if (!opened || 3 < timbreGroup) return false;
	Bit8u timbresInGroup = 3 == timbreGroup ? controlROMMap->timbreRCount : 64;
	if (timbresInGroup <= timbreNumber) return false;
	TimbreParam::CommonParam &timbreCommon = mt32ram.timbres[timbreGroup * 64 + timbreNumber].timbre.common;
	if (timbreCommon.partialMute == 0) return false;
	memcpy(soundName, timbreCommon.name, sizeof timbreCommon.name);
	soundName[sizeof timbreCommon.name] = 0;
	return true;
}